

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heatbath.hpp
# Opt level: O0

size_t bcl::heatbath::
       choose_next<std::vector<double,std::allocator<double>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                 (vector<double,_std::allocator<double>_> *weights,int param_2,
                 mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 *eng)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RDI;
  uniform_real_distribution<double> *this;
  result_type_conflict rVar3;
  double dVar4;
  size_t i;
  double target;
  double sum;
  uniform_real_distribution<double> dist;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffff98;
  double in_stack_ffffffffffffffa0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffa8;
  ulong uVar5;
  ulong __n;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffb0;
  double local_38;
  
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)0x10497c);
  std::vector<double,_std::allocator<double>_>::begin
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff98);
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff98);
  this = (uniform_real_distribution<double> *)
         std::
         accumulate<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>
                   (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  rVar3 = std::uniform_real_distribution<double>::operator()(this,in_stack_ffffffffffffff98);
  dVar4 = (double)this * rVar3;
  local_38 = 0.0;
  uVar5 = 0;
  while( true ) {
    __n = uVar5;
    sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
    if (sVar1 <= uVar5) {
      sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
      return sVar1 - 1;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,__n);
    local_38 = *pvVar2 + local_38;
    if (dVar4 <= local_38) break;
    uVar5 = __n + 1;
  }
  return __n;
}

Assistant:

static std::size_t choose_next(VEC const& weights, int /* present */, ENGINE& eng){
    std::uniform_real_distribution<> dist;
    double sum = std::accumulate(weights.begin(), weights.end(), 0.0);
    double target = sum * dist(eng);
    sum = 0;
    for (std::size_t i = 0; i < weights.size(); ++i) {
      sum += weights[i];
      if (target <= sum) return i;
    }
    return weights.size() - 1;
  }